

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iota_generator.cpp
# Opt level: O0

void __thiscall IotaGenerator_Compare_Test::TestBody(IotaGenerator_Compare_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  value_type local_88;
  value_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  value_type local_48;
  value_type local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  iota_generator g3;
  iota_generator g2;
  iota_generator g1;
  IotaGenerator_Compare_Test *this_local;
  
  iota_generator::iota_generator(&g2,3);
  iota_generator::iota_generator(&g3,3);
  iota_generator::iota_generator((iota_generator *)&gtest_ar.message_,5);
  local_40 = iota_generator::operator*(&g2);
  local_48 = iota_generator::operator*(&g3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_38,"*g1","*g2",&local_40,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker_poker/test_iota_generator.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_80 = iota_generator::operator*(&g2);
  local_88 = iota_generator::operator*((iota_generator *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_78,"*g1","*g3",&local_80,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker_poker/test_iota_generator.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST (IotaGenerator, Compare) {
    iota_generator g1 (3);
    iota_generator g2 (3);
    iota_generator g3 (5);
    EXPECT_EQ (*g1, *g2);
    EXPECT_NE (*g1, *g3);
}